

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

xxh_u64 XXH3_mix16B(xxh_u8 *input,xxh_u8 *secret,xxh_u64 seed64)

{
  xxh_u64 xVar1;
  xxh_u64 rhs;
  xxh_u64 xVar2;
  ulong lhs;
  long in_RDX;
  xxh_u64 input_hi;
  xxh_u64 input_lo;
  
  xVar1 = XXH_readLE64((void *)0x10aaed);
  rhs = XXH_readLE64((void *)0x10ab00);
  xVar2 = XXH_readLE64((void *)0x10ab19);
  lhs = xVar1 ^ xVar2 + in_RDX;
  XXH_readLE64((void *)0x10ab46);
  xVar1 = XXH3_mul128_fold64(lhs,rhs);
  return xVar1;
}

Assistant:

XXH_FORCE_INLINE xxh_u64 XXH3_mix16B(const xxh_u8* XXH_RESTRICT input,
                                     const xxh_u8* XXH_RESTRICT secret, xxh_u64 seed64)
{
#if defined(__GNUC__) && !defined(__clang__) /* GCC, not Clang */ \
  && defined(__i386__) && defined(__SSE2__)  /* x86 + SSE2 */ \
  && !defined(XXH_ENABLE_AUTOVECTORIZE)      /* Define to disable like XXH32 hack */
    /*
     * UGLY HACK:
     * GCC for x86 tends to autovectorize the 128-bit multiply, resulting in
     * slower code.
     *
     * By forcing seed64 into a register, we disrupt the cost model and
     * cause it to scalarize. See `XXH32_round()`
     *
     * FIXME: Clang's output is still _much_ faster -- On an AMD Ryzen 3600,
     * XXH3_64bits @ len=240 runs at 4.6 GB/s with Clang 9, but 3.3 GB/s on
     * GCC 9.2, despite both emitting scalar code.
     *
     * GCC generates much better scalar code than Clang for the rest of XXH3,
     * which is why finding a more optimal codepath is an interest.
     */
    XXH_COMPILER_GUARD(seed64);
#endif
    {   xxh_u64 const input_lo = XXH_readLE64(input);
        xxh_u64 const input_hi = XXH_readLE64(input+8);
        return XXH3_mul128_fold64(
            input_lo ^ (XXH_readLE64(secret)   + seed64),
            input_hi ^ (XXH_readLE64(secret+8) - seed64)
        );
    }
}